

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_perform_fetch(connectdata *conn)

{
  void *pvVar1;
  CURLcode CVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  
  pvVar1 = (conn->data->req).protop;
  lVar4 = *(long *)((long)pvVar1 + 0x18);
  if (lVar4 == 0) {
    lVar4 = *(long *)((long)pvVar1 + 0x20);
    if (lVar4 == 0) {
      Curl_failf(conn->data,"Cannot FETCH without a UID.");
      return CURLE_URL_MALFORMAT;
    }
    pcVar3 = "";
    if (*(char **)((long)pvVar1 + 0x28) != (char *)0x0) {
      pcVar3 = *(char **)((long)pvVar1 + 0x28);
    }
    if (*(long *)((long)pvVar1 + 0x30) != 0) {
      pcVar5 = "FETCH %s BODY[%s]<%s>";
      goto LAB_0012960a;
    }
    pcVar5 = "FETCH %s BODY[%s]";
  }
  else {
    pcVar3 = "";
    if (*(char **)((long)pvVar1 + 0x28) != (char *)0x0) {
      pcVar3 = *(char **)((long)pvVar1 + 0x28);
    }
    if (*(long *)((long)pvVar1 + 0x30) != 0) {
      pcVar5 = "UID FETCH %s BODY[%s]<%s>";
LAB_0012960a:
      CVar2 = imap_sendf(conn,pcVar5,lVar4,pcVar3);
      goto LAB_00129643;
    }
    pcVar5 = "UID FETCH %s BODY[%s]";
  }
  CVar2 = imap_sendf(conn,pcVar5,lVar4,pcVar3);
LAB_00129643:
  if (CVar2 == CURLE_OK) {
    (conn->proto).imapc.state = IMAP_FETCH;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode imap_perform_fetch(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct IMAP *imap = conn->data->req.protop;
  /* Check we have a UID */
  if(imap->uid) {

    /* Send the FETCH command */
    if(imap->partial)
      result = imap_sendf(conn, "UID FETCH %s BODY[%s]<%s>",
                            imap->uid,
                            imap->section ? imap->section : "",
                            imap->partial);
    else
      result = imap_sendf(conn, "UID FETCH %s BODY[%s]",
                            imap->uid,
                            imap->section ? imap->section : "");
  }
  else if(imap->mindex) {

    /* Send the FETCH command */
    if(imap->partial)
      result = imap_sendf(conn, "FETCH %s BODY[%s]<%s>",
                            imap->mindex,
                            imap->section ? imap->section : "",
                            imap->partial);
    else
      result = imap_sendf(conn, "FETCH %s BODY[%s]",
                            imap->mindex,
                            imap->section ? imap->section : "");
  }
  else {
        failf(conn->data, "Cannot FETCH without a UID.");
        return CURLE_URL_MALFORMAT;
  }
  if(!result)
    state(conn, IMAP_FETCH);

  return result;
}